

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkUniversal.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkUniversal::IntLoadConstraint_C
          (ChLinkUniversal *this,uint off_L,ChVectorDynamic<> *Qc,double c,bool do_clamp,
          double recovery_clamp)

{
  long lVar1;
  double *pdVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  undefined8 in_XMM1_Qb;
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  
  uVar6 = (ulong)off_L;
  iVar5 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if ((char)iVar5 == '\0') {
    return;
  }
  dVar14 = c * (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
               m_data.array[0];
  dVar12 = c * (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
               m_data.array[1];
  dVar10 = c * (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
               m_data.array[2];
  dVar8 = c * (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
              m_data.array[3];
  if (do_clamp) {
    auVar4._8_8_ = in_XMM1_Qb;
    auVar4._0_8_ = recovery_clamp;
    auVar3._8_8_ = 0x8000000000000000;
    auVar3._0_8_ = 0x8000000000000000;
    auVar7 = vxorpd_avx512vl(auVar4,auVar3);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = dVar14;
    auVar3 = vmaxsd_avx(auVar15,auVar7);
    auVar3 = vminsd_avx(auVar3,auVar4);
    dVar14 = auVar3._0_8_;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar12;
    auVar3 = vmaxsd_avx(auVar13,auVar7);
    auVar3 = vminsd_avx(auVar3,auVar4);
    dVar12 = auVar3._0_8_;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar10;
    auVar3 = vmaxsd_avx(auVar11,auVar7);
    auVar3 = vminsd_avx(auVar3,auVar4);
    dVar10 = auVar3._0_8_;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = dVar8;
    auVar3 = vmaxsd_avx(auVar9,auVar7);
    auVar3 = vminsd_avx(auVar3,auVar4);
    dVar8 = auVar3._0_8_;
  }
  lVar1 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((long)uVar6 < lVar1) {
    pdVar2 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    pdVar2[uVar6] = dVar14 + pdVar2[uVar6];
    uVar6 = (ulong)(off_L + 1);
    if ((long)uVar6 < lVar1) {
      pdVar2[uVar6] = dVar12 + pdVar2[uVar6];
      uVar6 = (ulong)(off_L + 2);
      if ((long)uVar6 < lVar1) {
        pdVar2[uVar6] = dVar10 + pdVar2[uVar6];
        uVar6 = (ulong)(off_L + 3);
        if ((long)uVar6 < lVar1) {
          pdVar2[uVar6] = dVar8 + pdVar2[uVar6];
          return;
        }
      }
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

void ChLinkUniversal::IntLoadConstraint_C(const unsigned int off_L,  ///< offset in Qc residual
                                          ChVectorDynamic<>& Qc,     ///< result: the Qc residual, Qc += c*C
                                          const double c,            ///< a scaling factor
                                          bool do_clamp,             ///< apply clamping to c*C?
                                          double recovery_clamp      ///< value for min/max clamping of c*C
                                          ) {
    if (!IsActive())
        return;

    double cnstr_x_violation = c * m_C(0);
    double cnstr_y_violation = c * m_C(1);
    double cnstr_z_violation = c * m_C(2);
    double cnstr_dot_violation = c * m_C(3);

    if (do_clamp) {
        cnstr_x_violation = ChMin(ChMax(cnstr_x_violation, -recovery_clamp), recovery_clamp);
        cnstr_y_violation = ChMin(ChMax(cnstr_y_violation, -recovery_clamp), recovery_clamp);
        cnstr_z_violation = ChMin(ChMax(cnstr_z_violation, -recovery_clamp), recovery_clamp);
        cnstr_dot_violation = ChMin(ChMax(cnstr_dot_violation, -recovery_clamp), recovery_clamp);
    }
    Qc(off_L + 0) += cnstr_x_violation;
    Qc(off_L + 1) += cnstr_y_violation;
    Qc(off_L + 2) += cnstr_z_violation;
    Qc(off_L + 3) += cnstr_dot_violation;
}